

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O2

UnicodeString *
icu_63::NumeratorSubstitution::fixdesc(UnicodeString *__return_storage_ptr__,UnicodeString *desc)

{
  short sVar1;
  UBool UVar2;
  int iVar3;
  ConstChar16Ptr local_28;
  char16_t *local_20;
  
  local_28.p_ = 
  L"<<㙎捩彵㌶ㄲ慓敭慖畬卥扵瑳瑩瑵潩䕮一椶畣㙟ㄳ临卆扵瑳瑩瑵潩䕮一椶畣㙟㈳䴲汵楴汰敩卲扵瑳瑩瑵潩䕮一椶畣㙟ㄳ䴹摯汵獵畓獢楴畴楴湯E㙎捩彵㌶㐲湉整牧污慐瑲畓獢楴畴楴湯E㙎捩彵㌶㘲牆捡楴湯污慐瑲畓獢楴畴楴湯E㙎捩彵㌶㔲扁潳畬整慖畬卥扵瑳瑩瑵潩䕮一椶畣㙟㈳丱浵牥瑡牯畓獢楴畴楴湯E\xf789\xfff4\xf7bd\xfff4\xf79c\xfff4\xf7ab\xfff4\xf894\xfff4\xf8c2\xfff4\xf85e\xfff4\xf8c2\xfff4\xf8c2\xfff4\xf8c2\xfff4\xf894\xfff4\xf8c2\xfff4\xf894\xfff4ﱪ\xfff4ﱪ\xfff4ﱴ\xfff4ﲿ\xfff4ﲝ\xfff4ﲮ\xfff4ﱻ\xfff4ﲌ\xfff4ﳆ\xfff4ﭏ\xfff4ﲰ\xfff4﮻\xfff4ﮊ\xfff4ﮗ\xfff4ﭵ\xfff4﯑\xfff4ﯩ\xfff4ﮯ\xfff4ﯽ\xfff4ﳣ\xfff4ﳃ\xfff4ףּ\xfff4ﳃ\xfff4ﳃ\xfff4ﳃ\xfff4ﳓ\xfff4ﳃ\xfff4ﳳ\xfff4㙎捩彵㌶渶浵敢㑲浩汰㌱潔敫䍮湯畳敭䕲一椶畣㙟㘳畮扭牥椴灭ㅬ匴浹潢偬潲楶敤䕲"
  ;
  UVar2 = UnicodeString::endsWith(desc,&local_28,2);
  local_20 = local_28.p_;
  if (UVar2 == '\0') {
    UnicodeString::UnicodeString(__return_storage_ptr__,desc);
  }
  else {
    sVar1 = (desc->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (desc->fUnion).fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    UnicodeString::UnicodeString(__return_storage_ptr__,desc,0,iVar3 + -1);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline UnicodeString fixdesc(const UnicodeString& desc) {
        if (desc.endsWith(LTLT, 2)) {
            UnicodeString result(desc, 0, desc.length()-1);
            return result;
        }
        return desc;
    }